

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O2

void __thiscall
fmcalc::dofmcalc_stepped(fmcalc *this,vector<LossRec,_std::allocator<LossRec>_> *agg_vec,int layer)

{
  pointer pLVar1;
  pointer ppVar2;
  ulong uVar3;
  pointer pvVar4;
  profile_rec_new *profile;
  LossRec *x;
  pointer x_00;
  
  pLVar1 = (agg_vec->super__Vector_base<LossRec,_std::allocator<LossRec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (x_00 = (agg_vec->super__Vector_base<LossRec,_std::allocator<LossRec>_>)._M_impl.
              super__Vector_impl_data._M_start; (x_00 != pLVar1 && (x_00->agg_id != 0));
      x_00 = x_00 + 1) {
    if ((0 < x_00->agg_id) &&
       (((0.0 < x_00->loss || (0.0 < x_00->retained_loss)) &&
        (uVar3 = (ulong)x_00->policytc_id, 0 < (long)uVar3)))) {
      pvVar4 = (this->profile_vec_stepped_).
               super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      profile = pvVar4[uVar3].super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (ppVar2 = *(pointer *)
                       ((long)&pvVar4[(int)uVar3].
                               super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>
                               ._M_impl.super__Vector_impl_data + 8), profile != ppVar2) {
        if (profile->calcrule_id != 100) {
          applycalcrule_stepped(profile,x_00,layer,profile + 1 == ppVar2);
        }
        uVar3 = (ulong)(uint)x_00->policytc_id;
        pvVar4 = (this->profile_vec_stepped_).
                 super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        profile = profile + 1;
      }
    }
  }
  return;
}

Assistant:

void fmcalc::dofmcalc_stepped(std::vector <LossRec>& agg_vec, int layer)
{
	for (LossRec& x : agg_vec) {
		if (x.agg_id == 0) break;
		if (x.agg_id > 0) {
			if (x.loss > 0 || x.retained_loss > 0) {
				if (x.policytc_id > 0) {
					auto iter = profile_vec_stepped_[x.policytc_id].cbegin();
					while (iter != profile_vec_stepped_[x.policytc_id].cend()) {
						const profile_rec_new& profile = *(iter);						
						iter++;
						if (iter == profile_vec_stepped_[x.policytc_id].cend()) {
							if (profile.calcrule_id != 100) applycalcrule_stepped(profile, x, layer,true);
						}
						else {
							if (profile.calcrule_id != 100) applycalcrule_stepped(profile, x, layer, false);
						}
					}
				}
			}
		}
	}
}